

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O0

int __thiscall MemTable::remove(MemTable *this,char *__filename)

{
  NodePosi key;
  size_t sVar1;
  NodePosi pQVar2;
  Result RVar3;
  allocator<char> local_61;
  string local_60;
  time_t local_40;
  time_t timestamp;
  byte local_30;
  bool valid;
  NodePosi local_20;
  longlong k_local;
  MemTable *this_local;
  
  local_20 = (NodePosi)__filename;
  k_local = (longlong)this;
  timestamp = (time_t)std::__cxx11::
                      list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                      ::begin(&this->qlist);
  RVar3 = skipSearch(this,(LevelIter)timestamp,(longlong)local_20);
  _valid = RVar3.node;
  local_30 = RVar3.valid;
  local_40 = time((time_t *)0x0);
  key = local_20;
  pQVar2 = _valid;
  if ((local_30 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    _put(this,pQVar2,(longlong)key,&local_60,true);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  if (((NodePosi)(_valid->data).key == local_20) && (((_valid->data).delete_flag & 1U) == 0)) {
    sVar1 = size_of_node(_valid);
    this->_size_bytes = this->_size_bytes - sVar1;
    std::__cxx11::string::operator=((string *)&(_valid->data).value,"");
    (_valid->data).timestamp = local_40;
    (_valid->data).value_length = 0;
    sVar1 = size_of_node(_valid);
    this->_size_bytes = sVar1 + this->_size_bytes;
    do {
      (_valid->data).delete_flag = true;
      _valid = _valid->above;
    } while (_valid != (QuadListNode<SSTableDataEntry> *)0x0);
    pQVar2 = (NodePosi)0x0;
  }
  else {
    pQVar2 = (NodePosi)(_valid->data).key;
    if ((pQVar2 == local_20) && (pQVar2 = _valid, ((_valid->data).delete_flag & 1U) != 0)) {
      (_valid->data).timestamp = local_40;
    }
  }
  return (int)CONCAT71((int7)((ulong)pQVar2 >> 8),1);
}

Assistant:

bool MemTable::remove(long long k) {
    auto[valid, to_delete] = skipSearch(qlist.begin(), k);
    auto timestamp = time(nullptr);
    if (!valid) {
        // k not found, as MemTable of a LSMTree, insert new tower marked as deleted.
        _put(to_delete, k, "", true);
    }
    if (to_delete->data.key == k && !to_delete->data.delete_flag) {
        // found k and has not been marked as deleted. mark deleted, remove value, update timestamp.
        _size_bytes -= size_of_node(to_delete);
        to_delete->data.value = "";
        to_delete->data.timestamp = timestamp;
        to_delete->data.value_length = 0;
        _size_bytes += size_of_node(to_delete);
        do {
            to_delete->data.delete_flag = true;
            to_delete = to_delete->above;
        } while (to_delete != nullptr);
        return true;
    }
    if (to_delete->data.key == k && to_delete->data.delete_flag) {
        // found k and its has been marked as deleted, just update timestamp.
        to_delete->data.timestamp = timestamp; // bytes level size don't change.
    }
    return true;
}